

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::AvgState<duckdb::hugeint_t>,long,duckdb::IntegerAverageOperationHugeint>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  long *plVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  long lVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  UnifiedVectorFormat idata;
  long *local_70;
  long local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if (*input == (Vector)0x0) {
    lVar3 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      lVar4 = *(long *)(input + 0x28);
      uVar5 = 0;
      uVar6 = 0;
      do {
        if (lVar4 == 0) {
          uVar12 = 0xffffffffffffffff;
        }
        else {
          uVar12 = *(ulong *)(lVar4 + uVar5 * 8);
        }
        uVar10 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar10 = count;
        }
        uVar11 = uVar10;
        if (uVar12 != 0) {
          uVar11 = uVar6;
          if (uVar12 == 0xffffffffffffffff) {
            lVar8 = uVar10 - uVar6;
            if (uVar6 <= uVar10 && lVar8 != 0) {
              uVar12 = *(ulong *)(state + 8);
              do {
                uVar11 = *(ulong *)(lVar3 + uVar6 * 8);
                uVar12 = uVar12 + uVar11;
                if (-1 < (long)uVar11 != uVar11 <= uVar12) {
                  *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + ((long)uVar11 >> 0x3f | 1U);
                }
                uVar6 = uVar6 + 1;
              } while (uVar10 != uVar6);
              *(long *)state = lVar8 + *(long *)state;
              *(ulong *)(state + 8) = uVar12;
              uVar11 = uVar6;
            }
          }
          else if (uVar6 < uVar10) {
            uVar11 = 0;
            do {
              if ((uVar12 >> (uVar11 & 0x3f) & 1) != 0) {
                *(long *)state = *(long *)state + 1;
                uVar2 = *(ulong *)(lVar3 + uVar6 * 8 + uVar11 * 8);
                lVar8 = *(long *)(state + 8);
                *(ulong *)(state + 8) = lVar8 + uVar2;
                if (-1 < (long)uVar2 != uVar2 <= lVar8 + uVar2) {
                  *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + ((long)uVar2 >> 0x3f | 1U);
                }
              }
              uVar11 = uVar11 + 1;
            } while ((uVar6 - uVar10) + uVar11 != 0);
            uVar11 = uVar6 + uVar11;
          }
        }
        uVar5 = uVar5 + 1;
        uVar6 = uVar11;
      } while (uVar5 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      plVar1 = *(long **)(input + 0x20);
      *(idx_t *)state = *(long *)state + count;
      AddToHugeint::AddConstant<duckdb::AvgState<duckdb::hugeint_t>,long>
                ((AvgState<duckdb::hugeint_t> *)state,*plVar1,count);
      return;
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_60 == 0) {
      if (count != 0) {
        lVar3 = *local_70;
        uVar6 = *(ulong *)(state + 8);
        iVar7 = 0;
        do {
          iVar9 = iVar7;
          if (lVar3 != 0) {
            iVar9 = (idx_t)*(uint *)(lVar3 + iVar7 * 4);
          }
          uVar5 = *(ulong *)(local_68 + iVar9 * 8);
          uVar6 = uVar6 + uVar5;
          if (-1 < (long)uVar5 != uVar5 <= uVar6) {
            *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + ((long)uVar5 >> 0x3f | 1U);
          }
          iVar7 = iVar7 + 1;
        } while (count != iVar7);
        *(idx_t *)state = *(long *)state + count;
        *(ulong *)(state + 8) = uVar6;
      }
    }
    else if (count != 0) {
      lVar3 = *local_70;
      iVar7 = 0;
      do {
        iVar9 = iVar7;
        if (lVar3 != 0) {
          iVar9 = (idx_t)*(uint *)(lVar3 + iVar7 * 4);
        }
        if ((*(ulong *)(local_60 + (iVar9 >> 6) * 8) >> (iVar9 & 0x3f) & 1) != 0) {
          *(long *)state = *(long *)state + 1;
          uVar6 = *(ulong *)(local_68 + iVar9 * 8);
          lVar4 = *(long *)(state + 8);
          *(ulong *)(state + 8) = lVar4 + uVar6;
          if (-1 < (long)uVar6 != uVar6 <= lVar4 + uVar6) {
            *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + ((long)uVar6 >> 0x3f | 1U);
          }
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}